

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_6x3(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  
  lVar14 = 0;
  memset(data,0,0x100);
  uVar7 = (ulong)start_col;
  do {
    lVar8 = *(long *)((long)sample_data + lVar14);
    bVar2 = *(byte *)(lVar8 + 5 + uVar7);
    iVar12 = (uint)*(byte *)(lVar8 + uVar7) + (uint)bVar2;
    bVar3 = *(byte *)(lVar8 + 1 + uVar7);
    bVar4 = *(byte *)(lVar8 + 4 + uVar7);
    iVar11 = (uint)bVar4 + (uint)bVar3;
    bVar5 = *(byte *)(lVar8 + 2 + uVar7);
    bVar6 = *(byte *)(lVar8 + 3 + uVar7);
    iVar13 = (uint)bVar5 + (uint)bVar6;
    uVar1 = iVar12 + iVar13;
    lVar8 = (ulong)*(byte *)(lVar8 + uVar7) - (ulong)bVar2;
    iVar9 = (uint)bVar3 - (uint)bVar4;
    lVar10 = (ulong)bVar5 - (ulong)bVar6;
    data[lVar14] = (uVar1 + iVar11) * 8 + -0x1800;
    data[lVar14 + 2] = (iVar12 - iVar13) * 0x2731 + 0x200 >> 10;
    data[lVar14 + 4] = (DCTELEM)(((ulong)uVar1 - (ulong)(uint)(iVar11 * 2)) * 0x16a1 + 0x200 >> 10);
    iVar11 = (int)lVar8;
    iVar12 = (int)((lVar10 + lVar8) * 0xbb6 + 0x200U >> 10);
    data[lVar14 + 1] = iVar12 + (iVar9 + iVar11) * 8;
    iVar13 = (int)lVar10;
    data[lVar14 + 3] = ((iVar11 - iVar9) - iVar13) * 8;
    data[lVar14 + 5] = iVar12 + (iVar13 - iVar9) * 8;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x18);
  lVar14 = 0;
  do {
    iVar11 = data[lVar14];
    iVar12 = data[lVar14 + 0x10];
    lVar8 = (long)(iVar12 + iVar11);
    data[lVar14] = (DCTELEM)((lVar8 + data[lVar14 + 8]) * 0x38e4 + 0x4000U >> 0xf);
    data[lVar14 + 0x10] = (DCTELEM)((lVar8 + (long)data[lVar14 + 8] * -2) * 0x283a + 0x4000U >> 0xf)
    ;
    data[lVar14 + 8] = (DCTELEM)((long)(iVar11 - iVar12) * 0x45ad + 0x4000U >> 0xf);
    lVar14 = lVar14 + 1;
  } while ((int)lVar14 != 6);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_6x3 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  INT32 tmp10, tmp11, tmp12;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We scale the results further by 2 as part of output adaption */
  /* scaling for different DCT size. */
  /* 6-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/12). */

  dataptr = data;
  for (ctr = 0; ctr < 3; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[5]);
    tmp11 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[3]);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[5]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[3]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 - 6 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(1.224744871)),                 /* c2 */
	      CONST_BITS-PASS1_BITS-1);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(0.707106781)), /* c4 */
	      CONST_BITS-PASS1_BITS-1);

    /* Odd part */

    tmp10 = DESCALE(MULTIPLY(tmp0 + tmp2, FIX(0.366025404)),     /* c5 */
		    CONST_BITS-PASS1_BITS-1);

    dataptr[1] = (DCTELEM) (tmp10 + ((tmp0 + tmp1) << (PASS1_BITS+1)));
    dataptr[3] = (DCTELEM) ((tmp0 - tmp1 - tmp2) << (PASS1_BITS+1));
    dataptr[5] = (DCTELEM) (tmp10 + ((tmp2 - tmp1) << (PASS1_BITS+1)));

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/6)*(8/3) = 32/9, which we partially
   * fold into the constant multipliers (other part was done in pass 1):
   * 3-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/6) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*2];
    tmp1 = dataptr[DCTSIZE*1];

    tmp2 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),        /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp1, FIX(1.257078722)), /* c2 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(MULTIPLY(tmp2, FIX(2.177324216)),               /* c1 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}